

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

uint8_t * __thiscall
edition_unittest::TestVerifyBigFieldNumberUint32_Nested::_InternalSerialize
          (TestVerifyBigFieldNumberUint32_Nested *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  TestVerifyBigFieldNumberUint32_Nested *value;
  ulong uVar3;
  uint8_t *puVar4;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestVerifyBigFieldNumberUint32_Nested>_>
  *value_00;
  int index;
  
  uVar1 = *(uint *)&this->field_0;
  if ((uVar1 & 2) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (1,(this->field_0)._impl_.optional_uint32_1_,puVar4);
  }
  if ((uVar1 & 4) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (2,(this->field_0)._impl_.optional_uint32_2_,puVar4);
  }
  if ((uVar1 & 1) != 0) {
    value = (this->field_0)._impl_.optional_nested_;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (9,(MessageLite *)value,*(int *)((long)&value->field_0 + 4),target,stream);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x10);
  for (index = 0; iVar2 != index; index = index + 1) {
    value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::TestVerifyBigFieldNumberUint32_Nested>>
                         (&(this->field_0)._impl_.repeated_nested_.super_RepeatedPtrFieldBase,index)
    ;
    target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                       (10,(MessageLite *)value_00,(value_00->field_0)._impl_._cached_size_.atom_,
                        target,stream);
  }
  if ((uVar1 & 8) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0x3f,(this->field_0)._impl_.optional_uint32_63_,puVar4);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0x40,(this->field_0)._impl_.optional_uint32_64_,puVar4);
  }
  if ((uVar1 & 0x20) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0x41,(this->field_0)._impl_.optional_uint32_65_,puVar4);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (0x42,(this->field_0)._impl_.optional_uint32_66_,puVar4);
  }
  if ((char)uVar1 < '\0') {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (1000,(this->field_0)._impl_.optional_uint32_1000_,puVar4);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    puVar4 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray
                       (5000,(this->field_0)._impl_.optional_uint32_5000_,puVar4);
  }
  uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar3 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestVerifyBigFieldNumberUint32_Nested::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestVerifyBigFieldNumberUint32_Nested& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestVerifyBigFieldNumberUint32.Nested)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // uint32 optional_uint32_1 = 1;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        1, this_._internal_optional_uint32_1(), target);
  }

  // uint32 optional_uint32_2 = 2;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        2, this_._internal_optional_uint32_2(), target);
  }

  // .edition_unittest.TestVerifyBigFieldNumberUint32.Nested optional_nested = 9;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        9, *this_._impl_.optional_nested_, this_._impl_.optional_nested_->GetCachedSize(), target,
        stream);
  }

  // repeated .edition_unittest.TestVerifyBigFieldNumberUint32.Nested repeated_nested = 10;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_nested_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_nested().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            10, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  // uint32 optional_uint32_63 = 63;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        63, this_._internal_optional_uint32_63(), target);
  }

  // uint32 optional_uint32_64 = 64;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        64, this_._internal_optional_uint32_64(), target);
  }

  // uint32 optional_uint32_65 = 65;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        65, this_._internal_optional_uint32_65(), target);
  }

  // uint32 optional_uint32_66 = 66;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        66, this_._internal_optional_uint32_66(), target);
  }

  // uint32 optional_uint32_1000 = 1000;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        1000, this_._internal_optional_uint32_1000(), target);
  }

  // uint32 optional_uint32_5000 = 5000;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
        5000, this_._internal_optional_uint32_5000(), target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestVerifyBigFieldNumberUint32.Nested)
  return target;
}